

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O2

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_DeleteModule
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,char *moduleId)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  LOGGER_LOG p_Var2;
  
  if ((deviceId == (char *)0x0 || registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
      moduleId == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_DeleteModule",0x7ee,1,"Input parameter cannot be NULL");
    }
    IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else {
    IVar1 = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_DELETE,deviceId,moduleId,
                                (BUFFER_HANDLE)0x0,0,(BUFFER_HANDLE)0x0);
  }
  return IVar1;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_DeleteModule(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, const char* moduleId)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceId == NULL) || (moduleId == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_DELETE, deviceId, moduleId, NULL, 0, NULL);
    }
    return result;
}